

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomControlPdu.cpp
# Opt level: O2

void __thiscall DIS::IntercomControlPdu::marshal(IntercomControlPdu *this,DataStream *dataStream)

{
  pointer pIVar1;
  long lVar2;
  ulong uVar3;
  IntercomCommunicationsParameters x;
  
  RadioCommunicationsFamilyPdu::marshal(&this->super_RadioCommunicationsFamilyPdu,dataStream);
  DataStream::operator<<(dataStream,(this->super_RadioCommunicationsFamilyPdu).field_0x2a);
  DataStream::operator<<(dataStream,(this->super_RadioCommunicationsFamilyPdu).field_0x2b);
  EntityID::marshal(&this->_sourceEntityID,dataStream);
  DataStream::operator<<(dataStream,this->_sourceCommunicationsDeviceID);
  DataStream::operator<<(dataStream,this->_sourceLineID);
  DataStream::operator<<(dataStream,this->_transmitPriority);
  DataStream::operator<<(dataStream,this->_transmitLineState);
  DataStream::operator<<(dataStream,this->_command);
  EntityID::marshal(&this->_masterEntityID,dataStream);
  DataStream::operator<<(dataStream,this->_masterCommunicationsDeviceID);
  DataStream::operator<<
            (dataStream,
             (uint)((ulong)((long)(this->_intercomParameters).
                                  super__Vector_base<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->_intercomParameters).
                                 super__Vector_base<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4));
  lVar2 = 8;
  for (uVar3 = 0;
      pIVar1 = (this->_intercomParameters).
               super__Vector_base<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->_intercomParameters).
                            super__Vector_base<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar1 >> 4);
      uVar3 = uVar3 + 1) {
    x._vptr_IntercomCommunicationsParameters =
         (_func_int **)&PTR__IntercomCommunicationsParameters_001b1438;
    x._8_8_ = *(undefined8 *)((long)&pIVar1->_vptr_IntercomCommunicationsParameters + lVar2);
    IntercomCommunicationsParameters::marshal(&x,dataStream);
    IntercomCommunicationsParameters::~IntercomCommunicationsParameters(&x);
    lVar2 = lVar2 + 0x10;
  }
  return;
}

Assistant:

void IntercomControlPdu::marshal(DataStream& dataStream) const
{
    RadioCommunicationsFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    dataStream << _controlType;
    dataStream << _communicationsChannelType;
    _sourceEntityID.marshal(dataStream);
    dataStream << _sourceCommunicationsDeviceID;
    dataStream << _sourceLineID;
    dataStream << _transmitPriority;
    dataStream << _transmitLineState;
    dataStream << _command;
    _masterEntityID.marshal(dataStream);
    dataStream << _masterCommunicationsDeviceID;
    dataStream << ( unsigned int )_intercomParameters.size();

     for(size_t idx = 0; idx < _intercomParameters.size(); idx++)
     {
        IntercomCommunicationsParameters x = _intercomParameters[idx];
        x.marshal(dataStream);
     }

}